

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_pcache_page * pcache1Fetch(sqlite3_pcache *p,uint iKey,int createFlag)

{
  PgHdr1 *pPVar1;
  PgHdr1 **ppPVar2;
  
  ppPVar2 = (PgHdr1 **)(((ulong)iKey % (ulong)*(uint *)(p + 0x30)) * 8 + *(long *)(p + 0x38));
  while( true ) {
    pPVar1 = *ppPVar2;
    if (pPVar1 == (PgHdr1 *)0x0) {
      if (createFlag == 0) {
        return (sqlite3_pcache_page *)0x0;
      }
      pPVar1 = pcache1FetchStage2((PCache1 *)p,iKey,createFlag);
      return &pPVar1->page;
    }
    if (pPVar1->iKey == iKey) break;
    ppPVar2 = &pPVar1->pNext;
  }
  if (pPVar1->isPinned != '\0') {
    return &pPVar1->page;
  }
  pcache1PinPage(pPVar1);
  return &pPVar1->page;
}

Assistant:

static sqlite3_pcache_page *pcache1Fetch(
  sqlite3_pcache *p, 
  unsigned int iKey, 
  int createFlag
){
#if PCACHE1_MIGHT_USE_GROUP_MUTEX || defined(SQLITE_DEBUG)
  PCache1 *pCache = (PCache1 *)p;
#endif

  assert( offsetof(PgHdr1,page)==0 );
  assert( pCache->bPurgeable || createFlag!=1 );
  assert( pCache->bPurgeable || pCache->nMin==0 );
  assert( pCache->bPurgeable==0 || pCache->nMin==10 );
  assert( pCache->nMin==0 || pCache->bPurgeable );
  assert( pCache->nHash>0 );
#if PCACHE1_MIGHT_USE_GROUP_MUTEX
  if( pCache->pGroup->mutex ){
    return (sqlite3_pcache_page*)pcache1FetchWithMutex(p, iKey, createFlag);
  }else
#endif
  {
    return (sqlite3_pcache_page*)pcache1FetchNoMutex(p, iKey, createFlag);
  }
}